

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_public(mbedtls_rsa_context *ctx,uchar *input,uchar *output)

{
  int iVar1;
  undefined1 local_50 [8];
  mbedtls_mpi T;
  size_t olen;
  int ret;
  uchar *output_local;
  uchar *input_local;
  mbedtls_rsa_context *ctx_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)local_50);
  olen._4_4_ = mbedtls_mpi_read_binary((mbedtls_mpi *)local_50,input,ctx->len);
  if (olen._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_50,&ctx->N);
    if (iVar1 < 0) {
      T.p = (mbedtls_mpi_uint *)ctx->len;
      olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)local_50,(mbedtls_mpi *)local_50,&ctx->E,
                                       &ctx->N,&ctx->RN);
      if (olen._4_4_ == 0) {
        olen._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)local_50,output,(size_t)T.p);
      }
    }
    else {
      olen._4_4_ = -4;
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_50);
  if (olen._4_4_ == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = olen._4_4_ + -0x4280;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_public( mbedtls_rsa_context *ctx,
                const unsigned char *input,
                unsigned char *output )
{
    int ret;
    size_t olen;
    mbedtls_mpi T;

    mbedtls_mpi_init( &T );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );

    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, &ctx->E, &ctx->N, &ctx->RN ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &T );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PUBLIC_FAILED + ret );

    return( 0 );
}